

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq
          (JsonStrValMatchesRegexReq *this,regex *regex)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_JsonValReq)._kind.super_type = (type)0x500000001;
  (this->super_JsonValReq)._allowNull = false;
  (this->super_JsonValReq)._vptr_JsonValReq = (_func_int **)&PTR__JsonStrValMatchesRegexReq_00301d30
  ;
  (this->_regex)._M_flags = regex->_M_flags;
  std::locale::locale(&(this->_regex)._M_loc,&regex->_M_loc);
  (this->_regex)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (regex->_M_automaton).
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (this->_regex)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (regex->_M_automaton).
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (regex->_M_automaton).
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_regex)._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  (regex->_M_automaton).
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  return;
}

Assistant:

JsonStrValMatchesRegexReq::JsonStrValMatchesRegexReq(std::regex regex) :
    JsonValReq {JsonVal::Kind::Str},
    _regex {std::move(regex)}
{
}